

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarextension.cpp
# Opt level: O3

void __thiscall QToolBarExtension::setOrientation(QToolBarExtension *this,Orientation o)

{
  QStyle *pQVar1;
  undefined8 uVar2;
  long lVar3;
  long in_FS_OFFSET;
  QStyleOption opt;
  QIcon local_70;
  undefined1 local_68 [16];
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  QPalettePrivate *pQStack_40;
  undefined1 *local_38;
  QObject *pQStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_30 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption((QStyleOption *)local_68,1,0);
  QStyleOption::initFrom((QStyleOption *)local_68,(QWidget *)this);
  if (o == Horizontal) {
    pQVar1 = QWidget::style((QWidget *)this);
    lVar3 = *(long *)pQVar1;
    uVar2 = 0x1b;
  }
  else {
    pQVar1 = QWidget::style((QWidget *)this);
    lVar3 = *(long *)pQVar1;
    uVar2 = 0x1c;
  }
  (**(code **)(lVar3 + 0x100))(&local_70,pQVar1,uVar2,local_68,this);
  QAbstractButton::setIcon((QAbstractButton *)this,&local_70);
  QIcon::~QIcon(&local_70);
  *(Orientation *)(this + 0x28) = o;
  QStyleOption::~QStyleOption((QStyleOption *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarExtension::setOrientation(Qt::Orientation o)
{
    QStyleOption opt;
    opt.initFrom(this);
    if (o == Qt::Horizontal) {
        setIcon(style()->standardIcon(QStyle::SP_ToolBarHorizontalExtensionButton, &opt, this));
    } else {
        setIcon(style()->standardIcon(QStyle::SP_ToolBarVerticalExtensionButton, &opt, this));
    }
    m_orientation = o;
}